

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void run_test<unsigned_int>(void)

{
  DivideTest<unsigned_int> dt;
  char msg [64];
  
  snprintf(msg,0x40,"Testing %s\n","uint32_t");
  std::operator<<((ostream *)&std::cout,msg);
  DivideTest<unsigned_int>::DivideTest(&dt);
  DivideTest<unsigned_int>::run(&dt);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}